

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_v2.cpp
# Opt level: O3

MPP_RET mpp_enc_start_async(MppEnc ctx)

{
  uint uVar1;
  char *pcVar2;
  MppThread *this;
  char name [16];
  char acStack_38 [24];
  
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","%p in\n","mpp_enc_start_async",ctx);
  }
  pcVar2 = strof_coding_type(*ctx);
  uVar1 = getpid();
  snprintf(acStack_38,0xf,"mpp_%se_%d",pcVar2,(ulong)uVar1);
  this = (MppThread *)operator_new(0x198);
  MppThread::MppThread(this,mpp_enc_async_thread,*(void **)((long)ctx + 0x70),acStack_38);
  *(MppThread **)((long)ctx + 0x68) = this;
  MppThread::start(this);
  if (((byte)mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","%p out\n","mpp_enc_start_async",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_start_async(MppEnc ctx)
{
    MppEncImpl *enc = (MppEncImpl *)ctx;
    char name[16];

    enc_dbg_func("%p in\n", enc);

    snprintf(name, sizeof(name) - 1, "mpp_%se_%d",
             strof_coding_type(enc->coding), getpid());

    enc->thread_enc = new MppThread(mpp_enc_async_thread, enc->mpp, name);
    enc->thread_enc->start();

    enc_dbg_func("%p out\n", enc);

    return MPP_OK;
}